

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandBaseType
          (ValidationState_t *_,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  spv_result_t sVar1;
  allocator<char> local_49;
  string local_48;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_28;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *ext_inst_name_local;
  Instruction *pIStack_18;
  uint32_t word_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_28 = ext_inst_name;
  ext_inst_name_local._4_4_ = word_index;
  pIStack_18 = inst;
  inst_local = (Instruction *)_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Base Type",&local_49);
  sVar1 = ValidateDebugInfoOperand
                    (_,&local_48,CommonDebugInfoDebugTypeBasic,pIStack_18,ext_inst_name_local._4_4_,
                     local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return sVar1;
}

Assistant:

spv_result_t ValidateOperandBaseType(
    ValidationState_t& _, const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  return ValidateDebugInfoOperand(_, "Base Type", CommonDebugInfoDebugTypeBasic,
                                  inst, word_index, ext_inst_name);
}